

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::CodeGenerator::GenerateAll
          (CodeGenerator *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *files,string *parameter,GeneratorContext *generator_context,string *error)

{
  FileDescriptor *pFVar1;
  uint uVar2;
  FileDescriptor *pFVar3;
  const_reference ppFVar4;
  ulong uVar5;
  AlphaNum *c;
  AlphaNum local_108;
  AlphaNum local_d8;
  string_view local_a8;
  AlphaNum local_98;
  string local_68;
  value_type local_48;
  FileDescriptor *file;
  size_t i;
  AlphaNum *pAStack_30;
  bool succeeded;
  string *error_local;
  GeneratorContext *generator_context_local;
  string *parameter_local;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *files_local;
  CodeGenerator *this_local;
  
  i._7_1_ = 1;
  file = (FileDescriptor *)0x0;
  pAStack_30 = (AlphaNum *)error;
  error_local = (string *)generator_context;
  generator_context_local = (GeneratorContext *)parameter;
  parameter_local = (string *)files;
  files_local = (vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 *)this;
  do {
    pFVar1 = file;
    pFVar3 = (FileDescriptor *)
             std::
             vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             ::size((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                     *)parameter_local);
    if (pFVar3 <= pFVar1) {
LAB_0158d260:
      return (bool)(i._7_1_ & 1);
    }
    ppFVar4 = std::
              vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              ::operator[]((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                            *)parameter_local,(size_type)file);
    local_48 = *ppFVar4;
    c = pAStack_30;
    uVar2 = (*this->_vptr_CodeGenerator[2])(this,local_48,generator_context_local,error_local);
    i._7_1_ = (byte)uVar2 & 1;
    if ((((uVar2 & 1) == 0) && (pAStack_30 != (AlphaNum *)0x0)) &&
       (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) != 0)) {
      std::__cxx11::string::operator=
                ((string *)pAStack_30,
                 "Code generator returned false but provided no error description.");
    }
    if ((pAStack_30 != (AlphaNum *)0x0) && (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)
       ) {
      local_a8 = FileDescriptor::name(local_48);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_98,local_a8);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_d8,": ");
      absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                (&local_108,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAStack_30);
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_68,(lts_20250127 *)&local_98,&local_d8,&local_108,c);
      std::__cxx11::string::operator=((string *)pAStack_30,(string *)&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      goto LAB_0158d260;
    }
    if ((i._7_1_ & 1) == 0) goto LAB_0158d260;
    file = (FileDescriptor *)&file->is_placeholder_;
  } while( true );
}

Assistant:

bool CodeGenerator::GenerateAll(const std::vector<const FileDescriptor*>& files,
                                const std::string& parameter,
                                GeneratorContext* generator_context,
                                std::string* error) const {
  // Default implementation is just to call the per file method, and prefix any
  // error string with the file to provide context.
  bool succeeded = true;
  for (size_t i = 0; i < files.size(); i++) {
    const FileDescriptor* file = files[i];
    succeeded = Generate(file, parameter, generator_context, error);
    if (!succeeded && error && error->empty()) {
      *error =
          "Code generator returned false but provided no error "
          "description.";
    }
    if (error && !error->empty()) {
      *error = absl::StrCat(file->name(), ": ", *error);
      break;
    }
    if (!succeeded) {
      break;
    }
  }
  return succeeded;
}